

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

VkClearValue
vkt::api::anon_unknown_0::makeClearColorValue(VkFormat format,float r,float g,float b,float a)

{
  tcu *this;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  VkClearValue VVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  TextureChannelClass TVar12;
  uint *puVar13;
  int *piVar14;
  tcu local_54 [8];
  IVec4 maxValues_1;
  UVec4 maxValues;
  TextureFormat tcuFormat;
  float a_local;
  float b_local;
  float g_local;
  float r_local;
  VkFormat format_local;
  VkClearValue clearValue;
  
  maxValues.m_data._8_8_ = ::vk::mapVkFormat(format);
  TVar12 = tcu::getTextureChannelClass(maxValues.m_data[3]);
  fVar8 = r;
  fVar9 = g;
  uVar10 = b;
  uVar11 = a;
  if (TVar12 != TEXTURECHANNELCLASS_FLOATING_POINT) {
    TVar12 = tcu::getTextureChannelClass(maxValues.m_data[3]);
    fVar8 = r;
    fVar9 = g;
    uVar10 = b;
    uVar11 = a;
    if (TVar12 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      TVar12 = tcu::getTextureChannelClass(maxValues.m_data[3]);
      fVar8 = r;
      fVar9 = g;
      uVar10 = b;
      uVar11 = a;
      if (TVar12 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        TVar12 = tcu::getTextureChannelClass(maxValues.m_data[3]);
        if (TVar12 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
          this = (tcu *)(maxValues_1.m_data + 2);
          tcu::getFormatMaxUintValue(this,(TextureFormat *)(maxValues.m_data + 2));
          puVar13 = tcu::Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,0);
          uVar1 = *puVar13;
          puVar13 = tcu::Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,1);
          uVar2 = *puVar13;
          puVar13 = tcu::Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,2);
          uVar3 = *puVar13;
          puVar13 = tcu::Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,3);
          fVar8 = (float)(long)((float)uVar1 * r);
          fVar9 = (float)(VkFormat)(long)((float)uVar2 * g);
          uVar10 = (float)(long)((float)uVar3 * b);
          uVar11 = (deUint32)(long)((float)*puVar13 * a);
        }
        else {
          TVar12 = tcu::getTextureChannelClass(maxValues.m_data[3]);
          fVar8 = r_local;
          fVar9 = (float)format_local;
          uVar10 = clearValue.depthStencil.depth;
          uVar11 = clearValue.depthStencil.stencil;
          if (TVar12 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
            tcu::getFormatMaxIntValue(local_54,(TextureFormat *)(maxValues.m_data + 2));
            piVar14 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_54,0);
            iVar4 = *piVar14;
            piVar14 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_54,1);
            iVar5 = *piVar14;
            piVar14 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_54,2);
            iVar6 = *piVar14;
            piVar14 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_54,3);
            fVar8 = (float)(long)((float)iVar4 * r);
            fVar9 = (float)(VkFormat)(long)((float)iVar5 * g);
            uVar10 = (float)(long)((float)iVar6 * b);
            uVar11 = (deUint32)(long)((float)*piVar14 * a);
          }
        }
      }
    }
  }
  clearValue.depthStencil.stencil = uVar11;
  clearValue.depthStencil.depth = (float)uVar10;
  format_local = (VkFormat)fVar9;
  r_local = fVar8;
  VVar7.depthStencil.stencil = format_local;
  VVar7.depthStencil.depth = r_local;
  VVar7._8_4_ = clearValue.depthStencil.depth;
  VVar7._12_4_ = clearValue.depthStencil.stencil;
  return VVar7;
}

Assistant:

VkClearValue makeClearColorValue (VkFormat format, float r, float g, float b, float a)
{
	const	TextureFormat tcuFormat	= mapVkFormat(format);
	VkClearValue clearValue;

	if (getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_FLOATING_POINT
		|| getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT
		|| getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
	{
		clearValue.color.float32[0] = r;
		clearValue.color.float32[1] = g;
		clearValue.color.float32[2] = b;
		clearValue.color.float32[3] = a;
	}
	else if (getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
	{
		UVec4 maxValues = getFormatMaxUintValue(tcuFormat);

		clearValue.color.uint32[0] = (deUint32)((float)maxValues[0] * r);
		clearValue.color.uint32[1] = (deUint32)((float)maxValues[1] * g);
		clearValue.color.uint32[2] = (deUint32)((float)maxValues[2] * b);
		clearValue.color.uint32[3] = (deUint32)((float)maxValues[3] * a);
	}
	else if (getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER)
	{
		IVec4 maxValues = getFormatMaxIntValue(tcuFormat);

		clearValue.color.int32[0] = (deUint32)((float)maxValues[0] * r);
		clearValue.color.int32[1] = (deUint32)((float)maxValues[1] * g);
		clearValue.color.int32[2] = (deUint32)((float)maxValues[2] * b);
		clearValue.color.int32[3] = (deUint32)((float)maxValues[3] * a);
	}
	else
		DE_FATAL("Unknown channel class");

	return clearValue;
}